

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<double>_>::SolveSOR
          (TPZMatrix<std::complex<double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<double>_> *F,TPZFMatrix<std::complex<double>_> *result,
          TPZFMatrix<std::complex<double>_> *residual,TPZFMatrix<std::complex<double>_> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  int iVar1;
  int extraout_var;
  complex<double> *pcVar3;
  int64_t j;
  long row;
  long lVar4;
  int64_t ic;
  long col;
  double extraout_XMM0_Qa;
  double dVar5;
  double extraout_XMM0_Qa_00;
  REAL extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  REAL extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  double in_XMM1_Qa;
  double dVar6;
  double dVar7;
  double local_108;
  double dStack_100;
  TPZFMatrix<std::complex<double>_> *local_f0;
  double local_e8;
  double dStack_e0;
  REAL local_d0;
  double local_c8;
  TPZFMatrix<std::complex<double>_> *local_c0;
  double *local_b8;
  long *local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  REAL local_60;
  long local_58;
  undefined1 local_50 [16];
  REAL local_40 [2];
  long lVar2;
  
  local_f0 = F;
  local_b0 = numiterations;
  local_60 = overrelax;
  if (residual == F) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
    return;
  }
  local_e8 = 2.0;
  dStack_e0 = 0.0;
  local_b8 = tol;
  local_d0 = *tol;
  local_c8 = 0.0;
  local_c0 = residual;
  std::operator*((complex<double> *)&local_e8,(complex<double> *)&local_d0);
  local_108 = extraout_XMM0_Qa + 1.0;
  dStack_90 = in_XMM1_Qa + 0.0;
  dStack_100 = dStack_90;
  if (local_c0 != (TPZFMatrix<std::complex<double>_> *)0x0) {
    local_108 = Norm(local_c0);
    dStack_100 = 0.0;
    dStack_90 = extraout_XMM0_Qb;
  }
  local_a8 = dStack_100;
  dStack_a0 = dStack_100;
  local_98 = local_108;
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_70 = (local_f0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  lVar4 = 0;
  local_78 = lVar2 + -1;
  local_58 = -1;
  if (direction != -1) {
    local_78 = lVar4;
    local_58 = lVar2;
  }
  if (lVar2 == 0 || extraout_var < 0) {
    lVar2 = lVar4;
  }
  local_68 = (ulong)(direction != -1) * 2 + -1;
  if (local_70 < 1) {
    local_70 = lVar4;
  }
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  dVar5 = local_98;
  while (lVar4 < *local_b0) {
    dVar5 = fabs(dVar5);
    dVar6 = ABS(*local_b8);
    dVar7 = 0.0;
    if (dVar5 <= dVar6) break;
    local_108 = 0.0;
    dStack_100 = 0.0;
    local_80 = lVar4;
    for (col = 0; lVar4 = local_78, col != local_70; col = col + 1) {
      for (; lVar4 != local_58; lVar4 = lVar4 + local_68) {
        (*(local_f0->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(local_f0,lVar4,col);
        local_e8 = extraout_XMM0_Qa_00;
        dStack_e0 = dVar6;
        for (row = 0; lVar2 != row; row = row + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,row);
          local_d0 = extraout_XMM0_Qa_01;
          local_c8 = dVar6;
          pcVar3 = TPZFMatrix<std::complex<double>_>::operator()(result,row,col);
          std::operator*((complex<double> *)&local_d0,pcVar3);
          local_e8 = local_e8 - extraout_XMM0_Qa_02;
          dStack_e0 = dStack_e0 - dVar6;
        }
        std::operator*((complex<double> *)&local_e8,(complex<double> *)&local_e8);
        local_108 = extraout_XMM0_Qa_03 + local_108;
        dStack_100 = dVar6 + dStack_100;
        local_40[0] = local_60;
        local_40[1] = 0.0;
        std::operator*((complex<double> *)local_40,(complex<double> *)&local_e8);
        local_d0 = extraout_XMM0_Qa_04;
        local_c8 = dVar6;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar4,lVar4);
        local_50._8_8_ = dVar6;
        std::operator/((complex<double> *)&local_d0,(complex<double> *)local_50);
        local_a8 = dVar6;
        dStack_a0 = dVar7;
        local_98 = extraout_XMM0_Qa_05;
        dStack_90 = extraout_XMM0_Qb_00;
        pcVar3 = TPZFMatrix<std::complex<double>_>::operator()(result,lVar4,col);
        dVar6 = local_98 + *(double *)pcVar3->_M_value;
        dVar7 = local_a8 + *(double *)(pcVar3->_M_value + 8);
        *(double *)pcVar3->_M_value = dVar6;
        *(double *)(pcVar3->_M_value + 8) = dVar7;
      }
    }
    std::sqrt<double>((complex<double> *)&local_108);
    dVar5 = extraout_XMM0_Qa_06;
    local_108 = extraout_XMM0_Qa_06;
    dStack_100 = dVar6;
    lVar4 = local_80 + 1;
  }
  if (local_c0 != (TPZFMatrix<std::complex<double>_> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,local_f0);
  }
  *local_b0 = lVar4;
  dVar5 = fabs(local_108);
  *local_b8 = dVar5;
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}